

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O0

void __thiscall wasm::LocalGraph::computeSSAIndexes(LocalGraph *this)

{
  bool bVar1;
  reference __in;
  type *ppLVar2;
  value_type *ppLVar3;
  mapped_type *this_00;
  reference ppLVar4;
  reference __in_00;
  type *__x;
  type *this_01;
  size_type sVar5;
  type *sets_2;
  type *index;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_false>
  local_148;
  iterator __end1_2;
  iterator __begin1_2;
  unordered_map<unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>
  *__range1_2;
  set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_> *local_128;
  mapped_type *sets_1;
  LocalSet *set_1;
  type *_;
  type *curr;
  _Self local_100;
  iterator __end1_1;
  iterator __begin1_1;
  Locations *__range1_1;
  value_type local_d8;
  LocalSet *set;
  Iterator __end2;
  undefined1 local_a0 [8];
  Iterator __begin2;
  type *__range2;
  type *sets;
  type *get;
  _Node_iterator_base<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false>
  local_60;
  iterator __end1;
  iterator __begin1;
  GetSetsMap *__range1;
  unordered_map<unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>
  indexSets;
  LocalGraph *this_local;
  
  indexSets._M_h._M_single_bucket = (__node_base_ptr)this;
  std::
  unordered_map<unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>
  ::unordered_map((unordered_map<unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>
                   *)&__range1);
  __end1 = std::
           unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
           ::begin(&this->getSetsMap);
  local_60._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
       ::end(&this->getSetsMap);
  while (bVar1 = std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false>
                            ,&local_60), bVar1) {
    __in = std::__detail::
           _Node_iterator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false,_false>
           ::operator*(&__end1);
    ppLVar2 = std::get<0ul,wasm::LocalGet*const,wasm::SmallSet<wasm::LocalSet*,2ul>>(__in);
    __begin2.flexibleIterator._M_node =
         (_Base_ptr)std::get<1ul,wasm::LocalGet*const,wasm::SmallSet<wasm::LocalSet*,2ul>>(__in);
    SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
    ::begin((Iterator *)local_a0,
            (SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
             *)__begin2.flexibleIterator._M_node);
    SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
    ::end((Iterator *)&set,
          (SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
           *)__begin2.flexibleIterator._M_node);
    while (bVar1 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                   ::
                   IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                   ::operator!=((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                                 *)local_a0,(Iterator *)&set), bVar1) {
      ppLVar3 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                ::
                IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                ::operator*((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                             *)local_a0);
      local_d8 = *ppLVar3;
      this_00 = std::
                unordered_map<unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>
                ::operator[]((unordered_map<unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>
                              *)&__range1,&(*ppLVar2)->index);
      std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>::
      insert(this_00,&local_d8);
      SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
      ::
      IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
      ::operator++((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                    *)local_a0);
    }
    std::__detail::
    _Node_iterator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false,_false>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
             ::begin(&this->locations);
  local_100._M_node =
       (_Base_ptr)
       std::
       map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
       ::end(&this->locations);
  while (bVar1 = std::operator!=(&__end1_1,&local_100), bVar1) {
    curr = &std::_Rb_tree_iterator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>::
            operator*(&__end1_1)->first;
    _ = (type *)std::get<0ul,wasm::Expression*const,wasm::Expression**>
                          ((pair<wasm::Expression_*const,_wasm::Expression_**> *)curr);
    set_1 = (LocalSet *)
            std::get<1ul,wasm::Expression*const,wasm::Expression**>
                      ((pair<wasm::Expression_*const,_wasm::Expression_**> *)curr);
    sets_1 = (mapped_type *)Expression::dynCast<wasm::LocalSet>((Expression *)*_);
    if ((LocalSet *)sets_1 != (LocalSet *)0x0) {
      local_128 = std::
                  unordered_map<unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>
                  ::operator[]((unordered_map<unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>
                                *)&__range1,&((LocalSet *)sets_1)->index);
      sVar5 = std::
              set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
              ::size(local_128);
      bVar1 = false;
      if (sVar5 == 1) {
        __range1_2 = (unordered_map<unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>
                      *)std::
                        set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
                        ::begin(local_128);
        ppLVar4 = std::_Rb_tree_const_iterator<wasm::LocalSet_*>::operator*
                            ((_Rb_tree_const_iterator<wasm::LocalSet_*> *)&__range1_2);
        bVar1 = *ppLVar4 != (LocalSet *)*_;
      }
      if (bVar1) {
        std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>::
        clear(local_128);
      }
    }
    std::_Rb_tree_iterator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>::operator++
              (&__end1_1);
  }
  __end1_2 = std::
             unordered_map<unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>
             ::begin((unordered_map<unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>
                      *)&__range1);
  local_148._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>
       ::end((unordered_map<unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>
              *)&__range1);
  while (bVar1 = std::__detail::operator!=
                           (&__end1_2.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_false>
                            ,&local_148), bVar1) {
    __in_00 = std::__detail::
              _Node_iterator<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_false,_false>
              ::operator*(&__end1_2);
    __x = std::
          get<0ul,unsigned_int_const,std::set<wasm::LocalSet*,std::less<wasm::LocalSet*>,std::allocator<wasm::LocalSet*>>>
                    (__in_00);
    this_01 = std::
              get<1ul,unsigned_int_const,std::set<wasm::LocalSet*,std::less<wasm::LocalSet*>,std::allocator<wasm::LocalSet*>>>
                        (__in_00);
    sVar5 = std::
            set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>::
            size(this_01);
    if (sVar5 == 1) {
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                (&(this->super_LocalGraphBase).SSAIndexes,__x);
    }
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_false,_false>
    ::operator++(&__end1_2);
  }
  std::
  unordered_map<unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>
                    *)&__range1);
  return;
}

Assistant:

void LocalGraph::computeSSAIndexes() {
  std::unordered_map<Index, std::set<LocalSet*>> indexSets;
  for (auto& [get, sets] : getSetsMap) {
    for (auto* set : sets) {
      indexSets[get->index].insert(set);
    }
  }
  for (auto& [curr, _] : locations) {
    if (auto* set = curr->dynCast<LocalSet>()) {
      auto& sets = indexSets[set->index];
      if (sets.size() == 1 && *sets.begin() != curr) {
        // While it has just one set, it is not the right one (us),
        // so mark it invalid.
        sets.clear();
      }
    }
  }
  for (auto& [index, sets] : indexSets) {
    if (sets.size() == 1) {
      SSAIndexes.insert(index);
    }
  }
}